

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O0

void dspl_Init(void)

{
  setlocale(6,"");
  initscr();
  curs_set(0);
  start_color();
  ColorSchemeIdx = dd_GetColorScheme2Idx();
  ApplyColorScheme();
  wbkgd(_stdscr,0x400);
  return;
}

Assistant:

void dspl_Init(void)
{
  setlocale(LC_ALL, "");

  initscr();
  curs_set(0);
  start_color();

  ColorSchemeIdx = dd_GetColorScheme2Idx();
  ApplyColorScheme();

  wbkgd(stdscr, COLOR_PAIR(CP_TABLE));
}